

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 float64_scalbn_s390x(float64 a,int n,float_status *status)

{
  FloatParts FVar1;
  
  FVar1._8_8_ = a >> 0x34 & 0x7ff | a >> 0x17 & 0x10000000000;
  FVar1.frac = a & 0xfffffffffffff;
  FVar1 = sf_canonicalize(FVar1,&float64_params,status);
  FVar1 = scalbn_decomposed(FVar1,n,status);
  FVar1 = round_canonical(FVar1,status,&float64_params);
  return FVar1.frac & 0xfffffffffffff | (FVar1._8_8_ & 0x7ff) << 0x34 |
         (FVar1._8_8_ & 0x10000000000) << 0x17;
}

Assistant:

float64 float64_scalbn(float64 a, int n, float_status *status)
{
    FloatParts pa = float64_unpack_canonical(a, status);
    FloatParts pr = scalbn_decomposed(pa, n, status);
    return float64_round_pack_canonical(pr, status);
}